

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QString,_QFileInfo>_>::moveAppend
          (QGenericArrayOps<std::pair<QString,_QFileInfo>_> *this,pair<QString,_QFileInfo> *b,
          pair<QString,_QFileInfo> *e)

{
  qsizetype *pqVar1;
  pair<QString,_QFileInfo> *ppVar2;
  pair<QString,_QFileInfo> *ppVar3;
  long lVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  
  if ((b != e) && (b < e)) {
    ppVar3 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).ptr;
    do {
      lVar4 = (this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size;
      pDVar5 = (b->first).d.d;
      (b->first).d.d = (Data *)0x0;
      ppVar2 = ppVar3 + lVar4;
      (ppVar2->first).d.d = pDVar5;
      pcVar6 = (b->first).d.ptr;
      (b->first).d.ptr = (char16_t *)0x0;
      (ppVar2->first).d.ptr = pcVar6;
      qVar7 = (b->first).d.size;
      (b->first).d.size = 0;
      (ppVar2->first).d.size = qVar7;
      QFileInfo::QFileInfo(&ppVar2->second,&b->second);
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<QString,_QFileInfo>_>).size;
      *pqVar1 = *pqVar1 + 1;
      b = b + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }